

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

bool __thiscall jpgd::jpeg_decoder::calc_mcu_block_order(jpeg_decoder *this)

{
  int iVar1;
  int iVar2;
  int local_30;
  int comp_id;
  int mcu_block;
  int num_blocks;
  int max_v_samp;
  int max_h_samp;
  int component_id;
  int component_num;
  jpeg_decoder *this_local;
  
  num_blocks = 0;
  mcu_block = 0;
  for (max_v_samp = 0; max_v_samp < this->m_comps_in_frame; max_v_samp = max_v_samp + 1) {
    if (num_blocks < this->m_comp_h_samp[max_v_samp]) {
      num_blocks = this->m_comp_h_samp[max_v_samp];
    }
    if (mcu_block < this->m_comp_v_samp[max_v_samp]) {
      mcu_block = this->m_comp_v_samp[max_v_samp];
    }
  }
  for (max_v_samp = 0; max_v_samp < this->m_comps_in_frame; max_v_samp = max_v_samp + 1) {
    this->m_comp_h_blocks[max_v_samp] =
         ((this->m_image_x_size * this->m_comp_h_samp[max_v_samp] + num_blocks + -1) / num_blocks +
         7) / 8;
    this->m_comp_v_blocks[max_v_samp] =
         ((this->m_image_y_size * this->m_comp_v_samp[max_v_samp] + mcu_block + -1) / mcu_block + 7)
         / 8;
  }
  if (this->m_comps_in_scan == 1) {
    this->m_mcus_per_row = this->m_comp_h_blocks[this->m_comp_list[0]];
    this->m_mcus_per_col = this->m_comp_v_blocks[this->m_comp_list[0]];
  }
  else {
    this->m_mcus_per_row = ((this->m_image_x_size + 7) / 8 + num_blocks + -1) / num_blocks;
    this->m_mcus_per_col = ((this->m_image_y_size + 7) / 8 + mcu_block + -1) / mcu_block;
  }
  if (this->m_comps_in_scan == 1) {
    this->m_mcu_org[0] = this->m_comp_list[0];
    this->m_blocks_per_mcu = 1;
  }
  else {
    this->m_blocks_per_mcu = 0;
    for (max_h_samp = 0; max_h_samp < this->m_comps_in_scan; max_h_samp = max_h_samp + 1) {
      iVar1 = this->m_comp_list[max_h_samp];
      comp_id = this->m_comp_h_samp[iVar1] * this->m_comp_v_samp[iVar1];
      while (comp_id != 0) {
        iVar2 = this->m_blocks_per_mcu;
        this->m_blocks_per_mcu = iVar2 + 1;
        this->m_mcu_org[iVar2] = iVar1;
        comp_id = comp_id + -1;
      }
    }
  }
  if (this->m_max_blocks_per_mcu < this->m_blocks_per_mcu) {
    this_local._7_1_ = false;
  }
  else {
    for (local_30 = 0; local_30 < this->m_blocks_per_mcu; local_30 = local_30 + 1) {
      if (3 < this->m_mcu_org[local_30]) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool jpeg_decoder::calc_mcu_block_order()
	{
		int component_num, component_id;
		int max_h_samp = 0, max_v_samp = 0;

		for (component_id = 0; component_id < m_comps_in_frame; component_id++)
		{
			if (m_comp_h_samp[component_id] > max_h_samp)
				max_h_samp = m_comp_h_samp[component_id];

			if (m_comp_v_samp[component_id] > max_v_samp)
				max_v_samp = m_comp_v_samp[component_id];
		}

		for (component_id = 0; component_id < m_comps_in_frame; component_id++)
		{
			m_comp_h_blocks[component_id] = ((((m_image_x_size * m_comp_h_samp[component_id]) + (max_h_samp - 1)) / max_h_samp) + 7) / 8;
			m_comp_v_blocks[component_id] = ((((m_image_y_size * m_comp_v_samp[component_id]) + (max_v_samp - 1)) / max_v_samp) + 7) / 8;
		}

		if (m_comps_in_scan == 1)
		{
			m_mcus_per_row = m_comp_h_blocks[m_comp_list[0]];
			m_mcus_per_col = m_comp_v_blocks[m_comp_list[0]];
		}
		else
		{
			m_mcus_per_row = (((m_image_x_size + 7) / 8) + (max_h_samp - 1)) / max_h_samp;
			m_mcus_per_col = (((m_image_y_size + 7) / 8) + (max_v_samp - 1)) / max_v_samp;
		}

		if (m_comps_in_scan == 1)
		{
			m_mcu_org[0] = m_comp_list[0];

			m_blocks_per_mcu = 1;
		}
		else
		{
			m_blocks_per_mcu = 0;

			for (component_num = 0; component_num < m_comps_in_scan; component_num++)
			{
				int num_blocks;

				component_id = m_comp_list[component_num];

				num_blocks = m_comp_h_samp[component_id] * m_comp_v_samp[component_id];

				while (num_blocks--)
					m_mcu_org[m_blocks_per_mcu++] = component_id;
			}
		}

		if (m_blocks_per_mcu > m_max_blocks_per_mcu)
			return false;

		for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++)
		{
			int comp_id = m_mcu_org[mcu_block];
			if (comp_id >= JPGD_MAX_QUANT_TABLES)
				return false;
		}

		return true;
	}